

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O2

void __thiscall Js::Profiler::Merge(Profiler *this,Profiler *profiler)

{
  TimeEntry *pTVar1;
  TimeEntry item;
  TimeEntry entry;
  TimeEntry item_00;
  undefined1 local_170 [8];
  FixedStack<Js::TimeEntry,_20> reverseStack;
  
  MergeTree(this,&this->rootNode,&profiler->rootNode);
  if (1 < (profiler->timeStack).curIndex + 1) {
    FixedStack<Js::TimeEntry,_20>::FixedStack((FixedStack<Js::TimeEntry,_20> *)local_170);
    do {
      pTVar1 = FixedStack<Js::TimeEntry,_20>::Pop(&profiler->timeStack);
      item._4_4_ = 0;
      item.tag = pTVar1->tag;
      item._2_2_ = *(undefined2 *)&pTVar1->field_0x2;
      item.time = pTVar1->time;
      FixedStack<Js::TimeEntry,_20>::Push((FixedStack<Js::TimeEntry,_20> *)local_170,item);
    } while (1 < (profiler->timeStack).curIndex + 1);
    do {
      pTVar1 = FixedStack<Js::TimeEntry,_20>::Pop((FixedStack<Js::TimeEntry,_20> *)local_170);
      entry._4_4_ = 0;
      entry.tag = pTVar1->tag;
      entry._2_2_ = *(undefined2 *)&pTVar1->field_0x2;
      entry.time = pTVar1->time;
      Push(this,entry);
      item_00._4_4_ = 0;
      item_00.tag = pTVar1->tag;
      item_00._2_2_ = *(undefined2 *)&pTVar1->field_0x2;
      item_00.time = pTVar1->time;
      FixedStack<Js::TimeEntry,_20>::Push(&profiler->timeStack,item_00);
    } while ((int)reverseStack.itemList[0x13].time != -1);
  }
  return;
}

Assistant:

void
    Profiler::Merge(Profiler * profiler)
    {
        MergeTree(&rootNode, &profiler->rootNode);
        if (profiler->timeStack.Count() > 1)
        {
            FixedStack<TimeEntry, MaxStackDepth> reverseStack;
            do
            {
                reverseStack.Push(*profiler->timeStack.Pop());
            }
            while (profiler->timeStack.Count() > 1);

            do
            {
                TimeEntry * entry = reverseStack.Pop();
                this->Push(*entry);
                profiler->timeStack.Push(*entry);
            }
            while (reverseStack.Count() != 0);
        }
    }